

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

bool __thiscall
QSQLiteResultPrivate::fetchNext
          (QSQLiteResultPrivate *this,ValueCache *values,int idx,bool initialFetch)

{
  QSqlError *this_00;
  long *plVar1;
  QString *pQVar2;
  double dVar3;
  char cVar4;
  undefined1 uVar5;
  int iVar6;
  pointer pQVar7;
  pointer pQVar8;
  sqlite3_int64 sVar9;
  char *pcVar10;
  QChar *pQVar11;
  ulong uVar12;
  longlong lVar13;
  int i;
  long lVar14;
  long lVar15;
  long in_FS_OFFSET;
  QString local_98;
  undefined1 local_78 [32];
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->skipRow == true) {
    this->skipRow = false;
    if ((this->firstRow).d.size != 0) {
      lVar14 = 0;
      uVar12 = 0;
      do {
        pQVar7 = QList<QVariant>::data(&this->firstRow);
        pQVar8 = QList<QVariant>::data(values);
        QVariant::operator=((QVariant *)((long)&(pQVar8->d).data + lVar14),
                            (QVariant *)((long)&(pQVar7->d).data + lVar14));
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x20;
      } while (uVar12 < (ulong)(this->firstRow).d.size);
    }
    uVar5 = this->skippedStatus;
    goto LAB_00112d56;
  }
  plVar1 = *(long **)&(this->super_QSqlCachedResultPrivate).field_0x8;
  this->skipRow = initialFetch;
  if (initialFetch) {
    QList<QVariant>::clear(&this->firstRow);
    iVar6 = sqlite3_column_count(this->stmt);
    QList<QVariant>::resize(&this->firstRow,(long)iVar6);
  }
  if (this->stmt == (sqlite3_stmt *)0x0) {
    QCoreApplication::translate((char *)local_58.data,"QSQLiteResult","Unable to fetch row",0);
    QCoreApplication::translate((char *)local_78,"QSQLiteResult","No query",0);
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (char16_t *)0x0;
    local_98.d.size = 0;
    this_00 = (QSqlError *)(local_78 + 0x18);
    QSqlError::QSqlError(this_00,(QString *)&local_58,(QString *)local_78,ConnectionError,&local_98)
    ;
    (**(code **)(*plVar1 + 0x28))(plVar1,this_00);
    QSqlError::~QSqlError(this_00);
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((sqlite3_vfs *)local_78._0_8_ != (sqlite3_vfs *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
      }
    }
LAB_00112a09:
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
LAB_00112d46:
    (**(code **)(*plVar1 + 0x18))(plVar1,0xfffffffe);
  }
  else {
    iVar6 = sqlite3_step(this->stmt);
    if (iVar6 < 100) {
      if ((iVar6 == 1) || (iVar6 == 0x13)) {
        sqlite3_reset(this->stmt);
        pQVar2 = *(QString **)
                  (*(long *)(*(long *)&(this->super_QSqlCachedResultPrivate).field_0x18 + 8) + 0xa8)
        ;
        QCoreApplication::translate((char *)local_58.data,"QSQLiteResult","Unable to fetch row",0);
        qMakeError((sqlite3 *)local_78,pQVar2,(ErrorType)&local_58,1);
        (**(code **)(*plVar1 + 0x28))(plVar1,(sqlite3 *)local_78);
        QSqlError::~QSqlError((QSqlError *)local_78);
        goto LAB_00112a09;
      }
LAB_00112cad:
      pQVar2 = *(QString **)
                (*(long *)(*(long *)&(this->super_QSqlCachedResultPrivate).field_0x18 + 8) + 0xa8);
      QCoreApplication::translate((char *)local_58.data,"QSQLiteResult","Unable to fetch row",0);
      qMakeError((sqlite3 *)local_78,pQVar2,(ErrorType)&local_58,1);
      (**(code **)(*plVar1 + 0x28))(plVar1,(sqlite3 *)local_78);
      QSqlError::~QSqlError((QSqlError *)local_78);
      if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
      sqlite3_reset(this->stmt);
      goto LAB_00112d46;
    }
    if (iVar6 != 0x65) {
      if (iVar6 == 100) {
        cVar4 = QSqlRecord::isEmpty();
        if (cVar4 != '\0') {
          initColumns(this,false);
        }
        uVar5 = 1;
        if (-1 < idx || initialFetch) {
          iVar6 = QSqlRecord::count();
          if (0 < iVar6) {
            lVar14 = (long)idx << 5;
            lVar15 = 0;
            do {
              i = (int)lVar15;
              iVar6 = sqlite3_column_type(this->stmt,i);
              switch(iVar6) {
              case 1:
switchD_00112ac5_caseD_1:
                sVar9 = sqlite3_column_int64(this->stmt,i);
                QVariant::QVariant((QVariant *)&local_58,sVar9);
                break;
              case 2:
                iVar6 = QSqlResult::numericalPrecisionPolicy();
                if (iVar6 == 2) goto switchD_00112ac5_caseD_1;
                if (iVar6 == 1) {
                  iVar6 = sqlite3_column_int(this->stmt,i);
                  QVariant::QVariant((QVariant *)&local_58,iVar6);
                }
                else {
                  dVar3 = sqlite3_column_double(this->stmt,i);
                  QVariant::QVariant((QVariant *)&local_58,dVar3);
                }
                break;
              default:
                pQVar11 = (QChar *)sqlite3_column_text16(this->stmt,i);
                iVar6 = sqlite3_column_bytes16(this->stmt,i);
                QString::QString((QString *)local_78,pQVar11,(ulong)(long)iVar6 >> 1);
                QVariant::QVariant((QVariant *)&local_58,(QString *)local_78);
                pQVar7 = QList<QVariant>::data(values);
                QVariant::operator=((QVariant *)((long)&(pQVar7->d).data + lVar14),
                                    (QVariant *)&local_58);
                QVariant::~QVariant((QVariant *)&local_58);
                if ((sqlite3_vfs *)local_78._0_8_ != (sqlite3_vfs *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    lVar13 = 2;
LAB_00112c44:
                    QArrayData::deallocate((QArrayData *)local_78._0_8_,lVar13,0x10);
                  }
                }
                goto LAB_00112c8c;
              case 4:
                pcVar10 = (char *)sqlite3_column_blob(this->stmt,i);
                iVar6 = sqlite3_column_bytes(this->stmt,i);
                QByteArray::QByteArray((QByteArray *)local_78,pcVar10,(long)iVar6);
                QVariant::QVariant((QVariant *)&local_58,(QByteArray *)local_78);
                pQVar7 = QList<QVariant>::data(values);
                QVariant::operator=((QVariant *)((long)&(pQVar7->d).data + lVar14),
                                    (QVariant *)&local_58);
                QVariant::~QVariant((QVariant *)&local_58);
                if ((sqlite3_vfs *)local_78._0_8_ != (sqlite3_vfs *)0x0) {
                  LOCK();
                  (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
                       (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i
                       + -1;
                  UNLOCK();
                  if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i
                      == 0) {
                    lVar13 = 1;
                    goto LAB_00112c44;
                  }
                }
                goto LAB_00112c8c;
              case 5:
                QVariant::QVariant((QVariant *)&local_58,
                                   (QMetaTypeInterface *)
                                   &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType,
                                   (void *)0x0);
              }
              pQVar7 = QList<QVariant>::data(values);
              QVariant::operator=((QVariant *)((long)&(pQVar7->d).data + lVar14),
                                  (QVariant *)&local_58);
              QVariant::~QVariant((QVariant *)&local_58);
LAB_00112c8c:
              lVar15 = lVar15 + 1;
              iVar6 = QSqlRecord::count();
              lVar14 = lVar14 + 0x20;
            } while (lVar15 < iVar6);
          }
          uVar5 = 1;
        }
        goto LAB_00112d56;
      }
      goto LAB_00112cad;
    }
    cVar4 = QSqlRecord::isEmpty();
    if (cVar4 != '\0') {
      initColumns(this,true);
    }
    (**(code **)(*plVar1 + 0x18))(plVar1,0xfffffffe);
    sqlite3_reset(this->stmt);
  }
  uVar5 = 0;
LAB_00112d56:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResultPrivate::fetchNext(QSqlCachedResult::ValueCache &values, int idx, bool initialFetch)
{
    Q_Q(QSQLiteResult);

    if (skipRow) {
        // already fetched
        Q_ASSERT(!initialFetch);
        skipRow = false;
        for(int i=0;i<firstRow.size();i++)
            values[i]=firstRow[i];
        return skippedStatus;
    }
    skipRow = initialFetch;

    if (initialFetch) {
        firstRow.clear();
        firstRow.resize(sqlite3_column_count(stmt));
    }

    if (!stmt) {
        q->setLastError(QSqlError(QCoreApplication::translate("QSQLiteResult", "Unable to fetch row"),
                                  QCoreApplication::translate("QSQLiteResult", "No query"), QSqlError::ConnectionError));
        q->setAt(QSql::AfterLastRow);
        return false;
    }
    int res = sqlite3_step(stmt);
    switch(res) {
    case SQLITE_ROW:
        // check to see if should fill out columns
        if (rInf.isEmpty())
            // must be first call.
            initColumns(false);
        if (idx < 0 && !initialFetch)
            return true;
        for (int i = 0; i < rInf.count(); ++i) {
            switch (sqlite3_column_type(stmt, i)) {
            case SQLITE_BLOB:
                values[i + idx] = QByteArray(static_cast<const char *>(
                            sqlite3_column_blob(stmt, i)),
                            sqlite3_column_bytes(stmt, i));
                break;
            case SQLITE_INTEGER:
                values[i + idx] = sqlite3_column_int64(stmt, i);
                break;
            case SQLITE_FLOAT:
                switch(q->numericalPrecisionPolicy()) {
                    case QSql::LowPrecisionInt32:
                        values[i + idx] = sqlite3_column_int(stmt, i);
                        break;
                    case QSql::LowPrecisionInt64:
                        values[i + idx] = sqlite3_column_int64(stmt, i);
                        break;
                    case QSql::LowPrecisionDouble:
                    case QSql::HighPrecision:
                    default:
                        values[i + idx] = sqlite3_column_double(stmt, i);
                        break;
                };
                break;
            case SQLITE_NULL:
                values[i + idx] = QVariant(QMetaType::fromType<QString>());
                break;
            default:
                values[i + idx] = QString(reinterpret_cast<const QChar *>(
                            sqlite3_column_text16(stmt, i)),
                            sqlite3_column_bytes16(stmt, i) / sizeof(QChar));
                break;
            }
        }
        return true;
    case SQLITE_DONE:
        if (rInf.isEmpty())
            // must be first call.
            initColumns(true);
        q->setAt(QSql::AfterLastRow);
        sqlite3_reset(stmt);
        return false;
    case SQLITE_CONSTRAINT:
    case SQLITE_ERROR:
        // SQLITE_ERROR is a generic error code and we must call sqlite3_reset()
        // to get the specific error message.
        res = sqlite3_reset(stmt);
        q->setLastError(qMakeError(drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                        "Unable to fetch row"), QSqlError::ConnectionError, res));
        q->setAt(QSql::AfterLastRow);
        return false;
    case SQLITE_MISUSE:
    case SQLITE_BUSY:
    default:
        // something wrong, don't get col info, but still return false
        q->setLastError(qMakeError(drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                        "Unable to fetch row"), QSqlError::ConnectionError, res));
        sqlite3_reset(stmt);
        q->setAt(QSql::AfterLastRow);
        return false;
    }
    return false;
}